

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManCheckSuppOverlap(Gia_Man_t *p,int iNode1,int iNode2)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  
  if (iNode2 == 0 || iNode1 == 0) {
    return 0;
  }
  if ((((-1 < iNode1) && (iNode1 < p->nObjs)) &&
      (Gia_ManCheckSuppMark_rec(p,p->pObjs + (uint)iNode1), -1 < iNode2)) &&
     (iVar1 = p->nObjs, iNode2 < iVar1)) {
    pGVar2 = p->pObjs;
    iVar3 = Gia_ManCheckSupp_rec(p,pGVar2 + (uint)iNode2);
    if (iNode1 < iVar1) {
      Gia_ManCheckSuppUnmark_rec(p,pGVar2 + (uint)iNode1);
      return iVar3;
    }
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManCheckSuppOverlap( Gia_Man_t * p, int iNode1, int iNode2 )
{
    int Result;
    if ( iNode1 == 0 || iNode2 == 0 )
        return 0;
    Gia_ManCheckSuppMark_rec( p, Gia_ManObj(p, iNode1) );
    Result = Gia_ManCheckSupp_rec( p, Gia_ManObj(p, iNode2) );
    Gia_ManCheckSuppUnmark_rec( p, Gia_ManObj(p, iNode1) );
    return Result;
}